

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xlsxio_read_advanced.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  void *local_28;
  xlsx_list_sheets_data sheetdata;
  xlsxioreader xlsxioread;
  char **argv_local;
  int argc_local;
  
  sheetdata.firstsheet = (char *)xlsxioread_open(filename);
  bVar1 = sheetdata.firstsheet != (char *)0x0;
  if (bVar1) {
    local_28 = (void *)0x0;
    printf("Available sheets:\n");
    xlsxioread_list_sheets(sheetdata.firstsheet,xlsx_list_sheets_callback,&local_28);
    xlsxioread_process(sheetdata.firstsheet,local_28,1,sheet_cell_callback,sheet_row_callback,0);
    free(local_28);
    xlsxioread_close(sheetdata.firstsheet);
  }
  else {
    fprintf(_stderr,"Error opening .xlsx file\n");
  }
  argv_local._4_4_ = (uint)!bVar1;
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char* argv[])
{
  xlsxioreader xlsxioread;
  //open .xlsx file for reading
  if ((xlsxioread = xlsxioread_open(filename)) == NULL) {
    fprintf(stderr, "Error opening .xlsx file\n");
    return 1;
  }
  //list available sheets
  struct xlsx_list_sheets_data sheetdata;
  sheetdata.firstsheet = NULL;
  printf("Available sheets:\n");
  xlsxioread_list_sheets(xlsxioread, xlsx_list_sheets_callback, &sheetdata);

  //read data
  xlsxioread_process(xlsxioread, sheetdata.firstsheet, XLSXIOREAD_SKIP_EMPTY_ROWS, sheet_cell_callback, sheet_row_callback, NULL);

  //clean up
  free(sheetdata.firstsheet);
  xlsxioread_close(xlsxioread);
  return 0;
}